

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.h
# Opt level: O0

void __thiscall tvm::runtime::NDArray::Container::Container(Container *this)

{
  Container *this_local;
  
  this->manager_ctx = (void *)0x0;
  this->deleter = (_func_void_Container_ptr *)0x0;
  this->array_type_code_ = 0;
  std::atomic<int>::atomic(&this->ref_counter_,0);
  std::vector<long,_std::allocator<long>_>::vector(&this->shape_);
  (this->dl_tensor).data = (void *)0x0;
  (this->dl_tensor).ndim = 0;
  (this->dl_tensor).shape = (int64_t *)0x0;
  (this->dl_tensor).strides = (int64_t *)0x0;
  (this->dl_tensor).byte_offset = 0;
  return;
}

Assistant:

Container() {
    dl_tensor.data = nullptr;
    dl_tensor.ndim = 0;
    dl_tensor.shape = nullptr;
    dl_tensor.strides = nullptr;
    dl_tensor.byte_offset = 0;
  }